

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model-loader.cpp
# Opt level: O0

void __thiscall llama_model_loader::load_data_for(llama_model_loader *this,ggml_tensor *cur)

{
  ushort uVar1;
  undefined4 uVar2;
  void *pvVar3;
  void *pvVar4;
  size_t __n;
  size_type sVar5;
  undefined8 uVar6;
  ulong uVar7;
  runtime_error *this_00;
  undefined8 uVar8;
  undefined4 *in_RSI;
  llama_model_loader *in_RDI;
  value_type *file;
  value_type *mapping;
  llama_tensor_weight *w;
  void *in_stack_ffffffffffffff58;
  vector<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>,_std::allocator<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>_>_>
  *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff98;
  string local_48 [32];
  const_reference local_28;
  const_reference local_20;
  llama_tensor_weight *local_18;
  undefined4 *local_10;
  
  local_10 = in_RSI;
  ggml_get_name(in_RSI);
  local_18 = require_weight(in_RDI,in_stack_ffffffffffffff98);
  if ((in_RDI->use_mmap & 1U) == 0) {
    if (*(long *)(local_10 + 0x3e) == 0) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model-loader.cpp"
                 ,0x368,"GGML_ASSERT(%s) failed","cur->data != nullptr");
    }
    uVar1 = local_18->idx;
    sVar5 = std::
            vector<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>,_std::allocator<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>_>_>
            ::size(&in_RDI->files);
    if (sVar5 <= uVar1) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model-loader.cpp"
                 ,0x369,"GGML_ASSERT(%s) failed","w.idx < files.size()");
    }
    local_28 = std::
               vector<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>,_std::allocator<std::unique_ptr<llama_file,_std::default_delete<llama_file>_>_>_>
               ::at(in_stack_ffffffffffffff60,(size_type)in_stack_ffffffffffffff58);
    std::unique_ptr<llama_file,_std::default_delete<llama_file>_>::operator->
              ((unique_ptr<llama_file,_std::default_delete<llama_file>_> *)0x45217f);
    llama_file::seek((llama_file *)in_stack_ffffffffffffff60,(size_t)in_stack_ffffffffffffff58,0);
    std::unique_ptr<llama_file,_std::default_delete<llama_file>_>::operator->
              ((unique_ptr<llama_file,_std::default_delete<llama_file>_> *)0x4521a2);
    ggml_nbytes(local_10);
    llama_file::read_raw((llama_file *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,0x4521da)
    ;
  }
  else {
    local_20 = std::
               vector<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>,_std::allocator<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>_>_>
               ::at((vector<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>,_std::allocator<std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>_>_>
                     *)in_stack_ffffffffffffff60,(size_type)in_stack_ffffffffffffff58);
    if (*(long *)(local_10 + 0x3e) == 0) {
      std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>::operator->
                ((unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_> *)0x45204a);
      pvVar3 = llama_mmap::addr((llama_mmap *)0x452052);
      *(size_t *)(local_10 + 0x3e) = (long)pvVar3 + local_18->offs;
    }
    else {
      pvVar3 = *(void **)(local_10 + 0x3e);
      std::unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_>::operator->
                ((unique_ptr<llama_mmap,_std::default_delete<llama_mmap>_> *)0x452093);
      pvVar4 = llama_mmap::addr((llama_mmap *)0x45209b);
      pvVar4 = (void *)((long)pvVar4 + local_18->offs);
      __n = ggml_nbytes(local_10);
      memcpy(pvVar3,pvVar4,__n);
    }
  }
  if ((in_RDI->check_tensors & 1U) != 0) {
    uVar2 = *local_10;
    uVar8 = *(undefined8 *)(local_10 + 0x3e);
    uVar6 = ggml_nbytes(local_10);
    uVar7 = ggml_validate_row_data(uVar2,uVar8,uVar6);
    if ((uVar7 & 1) == 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      uVar8 = ggml_get_name(local_10);
      format_abi_cxx11_((char *)local_48,"tensor \'%s\' has invalid data",uVar8);
      std::runtime_error::runtime_error(this_00,local_48);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return;
}

Assistant:

void llama_model_loader::load_data_for(struct ggml_tensor * cur) const {
    const auto & w = require_weight(ggml_get_name(cur));

    if (use_mmap) {
        const auto & mapping = mappings.at(w.idx);
        if (cur->data == nullptr) {
            cur->data = (uint8_t *)mapping->addr() + w.offs;
        } else {
            memcpy(cur->data, (uint8_t *)mapping->addr() + w.offs, ggml_nbytes(cur));
        }
    } else {
        GGML_ASSERT(cur->data != nullptr);
        GGML_ASSERT(w.idx < files.size());
        const auto & file = files.at(w.idx);
        file->seek(w.offs, SEEK_SET);
        file->read_raw(cur->data, ggml_nbytes(cur));
    }

    if (check_tensors && !ggml_validate_row_data(cur->type, cur->data, ggml_nbytes(cur))) {
        throw std::runtime_error(format("tensor '%s' has invalid data", ggml_get_name(cur)));
    }
}